

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_DoubleEq_Test::Body(iu_MatcherFailure_x_iutest_x_DoubleEq_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard_1;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  string local_238;
  string local_218;
  AssertionResult iutest_ar;
  FInt local_1d0 [5];
  undefined4 local_1a4;
  undefined1 local_1a0 [8];
  FInt local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1a0 = (undefined1  [8])&PTR__IMatcher_00223d28;
  local_198.iv = 0x3ff0000000000000;
  iutest::detail::FloatingPointEqMatcher<double>::operator()
            (&iutest_ar,(FloatingPointEqMatcher<double> *)local_1a0,&(anonymous_namespace)::d0);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<double>(&local_238,&(anonymous_namespace)::d0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_218,(detail *)local_238._M_dataplus._M_p,"DoubleEq(1.0)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1e7,local_218._M_dataplus._M_p);
    local_1a4 = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1.super_ScopedGuard.m_test_flags = guard.super_ScopedGuard.m_test_flags;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"Eq: ",(allocator<char> *)local_1d0);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1e7,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  local_1d0[0].fv = 0.0 / (anonymous_namespace)::d0;
  local_1a0 = (undefined1  [8])&PTR__IMatcher_00223d28;
  local_198.fv = local_1d0[0].fv;
  iutest::detail::FloatingPointEqMatcher<double>::operator()
            (&iutest_ar,(FloatingPointEqMatcher<double> *)local_1a0,&local_1d0[0].fv);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    _guard = 0.0 / (anonymous_namespace)::d0;
    iutest::PrintToString<double>(&local_238,(double *)&guard);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_218,(detail *)local_238._M_dataplus._M_p,"DoubleEq(0/d0)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1e8,local_218._M_dataplus._M_p);
    local_1a4 = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard_1;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"Eq: ",(allocator<char> *)local_1d0);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1e8,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  local_1d0[0].fv = 0.0 / (anonymous_namespace)::d0;
  local_1a0 = (undefined1  [8])&PTR__IMatcher_00223d28;
  local_198.fv = local_1d0[0].fv;
  iutest::detail::FloatingPointEqMatcher<double>::operator()
            (&iutest_ar,(FloatingPointEqMatcher<double> *)local_1a0,&local_1d0[0].fv);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    _guard = 0.0 / (anonymous_namespace)::d0;
    iutest::PrintToString<double>(&local_238,(double *)&guard);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_218,(detail *)local_238._M_dataplus._M_p,"FloatingPointEq(0/d0)",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1e9,local_218._M_dataplus._M_p);
    local_1a4 = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard_1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"Eq: ",(allocator<char> *)local_1d0);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1e9,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, DoubleEq)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(d0, DoubleEq(1.0)), "Eq: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0/d0, DoubleEq(0/d0)), "Eq: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0/d0, FloatingPointEq(0/d0)), "Eq: " );
}